

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

string * lsvm::string::new_string(char *str)

{
  uint32_t uVar1;
  byte *pbVar2;
  string *s_00;
  char *__dest;
  byte *in_RDI;
  string *r;
  uint32_t size;
  uint8_t *s4;
  uint8_t *s3;
  uint8_t *s2;
  uint8_t *s;
  uint32_t count;
  size_t in_stack_ffffffffffffffb8;
  byte *local_20;
  uint32_t local_14;
  
  local_14 = 0;
  local_20 = in_RDI;
  do {
    if (*local_20 == 0) {
      uVar1 = (int)local_20 - (int)in_RDI;
      s_00 = (string *)memory::allocate(in_stack_ffffffffffffffb8);
      s_00->count = local_14;
      s_00->size = uVar1;
      __dest = c_str(s_00);
      memcpy(__dest,in_RDI,(ulong)(uVar1 + 1));
      return s_00;
    }
    if (*local_20 < 0x80) {
      local_20 = local_20 + 1;
    }
    else {
      if (*local_20 < 0xc2) {
        return (string *)0x0;
      }
      if (*local_20 < 0xe0) {
        if ((local_20[1] & 0xc0) != 0x80) {
          return (string *)0x0;
        }
        local_20 = local_20 + 2;
      }
      else if (*local_20 < 0xf0) {
        if ((local_20[1] & 0xc0) != 0x80) {
          return (string *)0x0;
        }
        if ((*local_20 == 0xe0) && (local_20[1] < 0xa0)) {
          return (string *)0x0;
        }
        if ((local_20[2] & 0xc0) != 0x80) {
          return (string *)0x0;
        }
        local_20 = local_20 + 3;
      }
      else {
        if (0xf4 < *local_20) {
          return (string *)0x0;
        }
        pbVar2 = local_20 + 1;
        if ((*pbVar2 & 0xc0) != 0x80) {
          return (string *)0x0;
        }
        if ((*local_20 == 0xf0) && (*pbVar2 < 0x90)) {
          return (string *)0x0;
        }
        if ((*local_20 == 0xf4) && (0x8f < *pbVar2)) {
          return (string *)0x0;
        }
        if ((local_20[2] & 0xc0) != 0x80) {
          return (string *)0x0;
        }
        if ((local_20[3] & 0xc0) != 0x80) {
          return (string *)0x0;
        }
        local_20 = local_20 + 4;
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

string* new_string(const char* str){
    uint32_t count = 0;
    uint8_t* s = reinterpret_cast<uint8_t*>(const_cast<char*>(str));
    uint8_t* s2;
    uint8_t* s3;
    uint8_t* s4;
    while(*s != 0){
        if (*s < 0x80) {
            ++s;
        } else if (*s < 0xC2) {
            /* continuation or overlong 2-byte sequence */
            return null;
        } else if (*s < 0xE0) {
            /* 2-byte sequence */
            s2 = s+1;
            if ((*s2 & 0xC0) != 0x80)
                return null;
            s += 2;
        } else if (*s < 0xF0) {
            /* 3-byte sequence */
            s2 = s+1;
            if ((*s2 & 0xC0) != 0x80)
                return null;
            if (*s == 0xE0 && *s2 < 0xA0)
                return null; /* overlong */
            s3 = s2+1;
            if ((*s3 & 0xC0) != 0x80)
               return null; 
            s += 3;
        } else if (*s < 0xF5) {
            /* 4-byte sequence */
            s2 = s+1;
            if ((*s2 & 0xC0) != 0x80)
                return null;
            if (*s == 0xF0 && *s2 < 0x90)
                return null; /* overlong */
            if (*s == 0xF4 && *s2 >= 0x90)
                return null; /* > U+10FFFF */
            s3 = s2+1;
            if ((*s3 & 0xC0) != 0x80)
                return null;
            s4 = s3+1;
            if ((*s4 & 0xC0) != 0x80)
                return null;
            s += 4;
        } else {
            return null;
        }
        ++count; 
    }

    uint32_t size = static_cast<uint32_t>(s - reinterpret_cast<uint8_t*>(const_cast<char*>(str)));

    string* r = (string*) lsvm::memory::allocate(sizeof(string)+size+1);
    r->count = count;
    r->size = size;

    memcpy(c_str(r),str,size+1);

    return r;
}